

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

sexp_conflict
json_write_object(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  sexp_conflict psVar4;
  long in_RCX;
  sexp in_RDX;
  long in_RDI;
  bool bVar5;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict tmp;
  sexp_conflict val;
  sexp_conflict key;
  sexp_conflict cur;
  sexp_conflict ls;
  undefined1 *local_70;
  sexp_conflict out_00;
  sexp_conflict obj_00;
  sexp_conflict in_stack_ffffffffffffffa8;
  sexp_conflict self_00;
  char *in_stack_ffffffffffffffb0;
  sexp_conflict ctx_00;
  sexp_conflict self_01;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 local_28;
  
  self_01 = (sexp_conflict)&DAT_0000043e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  memset(&local_70,0,0x10);
  lVar3 = sexp_length_op(in_RDI,0,1,in_RDX);
  if (lVar3 == 0x3e) {
    sexp_json_write_exception
              ((sexp_conflict)in_stack_ffffffffffffffc0,self_01,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
  }
  self_00 = (sexp_conflict)&stack0xffffffffffffffb8;
  ctx_00 = *(sexp_conflict *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
  local_70 = &stack0xffffffffffffffa0;
  out_00 = *(sexp_conflict *)(in_RDI + 0x6080);
  *(undefined1 ***)(in_RDI + 0x6080) = &local_70;
  obj_00 = (sexp_conflict)&DAT_0000043e;
  local_28 = in_RDX;
  if (*(long *)(in_RCX + 0x28) == 0) {
    putc(0x7b,*(FILE **)(in_RCX + 0x20));
  }
  else if (*(ulong *)(in_RCX + 0x38) < *(ulong *)(in_RCX + 0x50)) {
    lVar3 = *(long *)(in_RCX + 0x38);
    *(long *)(in_RCX + 0x38) = lVar3 + 1;
    *(undefined1 *)(*(long *)(in_RCX + 0x28) + lVar3) = 0x7b;
  }
  else {
    sexp_buffered_write_char(in_RDI,0x7b,in_RCX);
  }
  while( true ) {
    psVar4 = obj_00;
    bVar5 = false;
    if ((local_28 & 3) == 0) {
      bVar5 = ((sexp)local_28)->tag == 6;
    }
    if (!bVar5) goto LAB_00105a66;
    obj_00 = psVar4;
    if ((sexp)local_28 != in_RDX) {
      if (*(long *)(in_RCX + 0x28) == 0) {
        putc(0x2c,*(FILE **)(in_RCX + 0x20));
        obj_00 = psVar4;
      }
      else if (*(ulong *)(in_RCX + 0x38) < *(ulong *)(in_RCX + 0x50)) {
        lVar3 = *(long *)(in_RCX + 0x38);
        *(long *)(in_RCX + 0x38) = lVar3 + 1;
        *(undefined1 *)(*(long *)(in_RCX + 0x28) + lVar3) = 0x2c;
      }
      else {
        sexp_buffered_write_char(in_RDI,0x2c,in_RCX);
        obj_00 = psVar4;
      }
    }
    piVar1 = (int *)((FILE *)local_28)->_IO_read_ptr;
    if ((((ulong)piVar1 & 3) != 0) || (*piVar1 != 6)) break;
    piVar2 = *(int **)(piVar1 + 2);
    if ((((ulong)piVar2 & 0xf) != 6) && ((((ulong)piVar2 & 3) != 0 || (*piVar2 != 7)))) {
      psVar4 = sexp_json_write_exception
                         ((sexp_conflict)in_stack_ffffffffffffffc0,self_01,(char *)ctx_00,self_00);
      goto LAB_00105a66;
    }
    sexp_symbol_to_string_op(in_RDI,0,1,piVar2);
    psVar4 = json_write(ctx_00,self_00,obj_00,out_00);
    if ((((ulong)psVar4 & 3) == 0) && (psVar4->tag == 0x13)) goto LAB_00105a66;
    if (*(long *)(in_RCX + 0x28) == 0) {
      putc(0x3a,*(FILE **)(in_RCX + 0x20));
    }
    else if (*(ulong *)(in_RCX + 0x38) < *(ulong *)(in_RCX + 0x50)) {
      lVar3 = *(long *)(in_RCX + 0x38);
      *(long *)(in_RCX + 0x38) = lVar3 + 1;
      *(undefined1 *)(*(long *)(in_RCX + 0x28) + lVar3) = 0x3a;
    }
    else {
      sexp_buffered_write_char(in_RDI,0x3a,in_RCX);
    }
    in_stack_ffffffffffffffc0 = *(undefined8 *)(piVar1 + 4);
    psVar4 = json_write(ctx_00,self_00,obj_00,out_00);
    if ((((ulong)psVar4 & 3) == 0) && (psVar4->tag == 0x13)) goto LAB_00105a66;
    local_28 = ((FILE *)local_28)->_IO_read_end;
    self_01 = psVar4;
  }
  psVar4 = sexp_json_write_exception
                     ((sexp_conflict)in_stack_ffffffffffffffc0,self_01,(char *)ctx_00,self_00);
LAB_00105a66:
  if (*(long *)(in_RCX + 0x28) == 0) {
    putc(0x7d,*(FILE **)(in_RCX + 0x20));
  }
  else if (*(ulong *)(in_RCX + 0x38) < *(ulong *)(in_RCX + 0x50)) {
    lVar3 = *(long *)(in_RCX + 0x38);
    *(long *)(in_RCX + 0x38) = lVar3 + 1;
    *(undefined1 *)(*(long *)(in_RCX + 0x28) + lVar3) = 0x7d;
  }
  else {
    sexp_buffered_write_char(in_RDI,0x7d,in_RCX);
  }
  *(sexp_conflict *)(in_RDI + 0x6080) = ctx_00;
  return psVar4;
}

Assistant:

sexp json_write_object(sexp ctx, sexp self, const sexp obj, sexp out) {
  sexp ls, cur, key, val;
  sexp_gc_var2(tmp, res);
  if (sexp_length(ctx, obj) == SEXP_FALSE)
     sexp_json_write_exception(ctx, self, "unable to encode circular list", obj);
  sexp_gc_preserve2(ctx, tmp, res);
  res = SEXP_VOID;
  sexp_write_char(ctx, '{', out);
  for (ls = obj; sexp_pairp(ls); ls = sexp_cdr(ls)) {
    if (ls != obj)
      sexp_write_char(ctx, ',', out);
    cur = sexp_car(ls);
    if (!sexp_pairp(cur)) {
      res = sexp_json_write_exception(ctx, self, "unable to encode key-value pair: not a pair", obj);
      break;
    }
    key = sexp_car(cur);
    if (!sexp_symbolp(key)) {
      res = sexp_json_write_exception(ctx, self, "unable to encode key: not a symbol", key);
      break;
    }
    tmp = sexp_symbol_to_string(ctx, key);
    tmp = json_write(ctx, self, tmp, out);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    }
    sexp_write_char(ctx, ':', out);
    val = sexp_cdr(cur);
    tmp = json_write(ctx, self, val, out);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    }
  }
  sexp_write_char(ctx, '}', out);
  sexp_gc_release2(ctx);
  return res;
}